

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O3

void * disk_read_thread(void *args)

{
  fdb_status fVar1;
  int iVar2;
  uint64_t size;
  fdb_kvs_handle *st;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  fdb_doc *doc;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  fdb_kvs_handle *snap_db;
  timeval __test_begin;
  fdb_doc *local_68;
  fdb_snapshot_info_t *local_60;
  ulong local_58;
  ulong local_50;
  fdb_kvs_handle *local_48;
  timeval local_40;
  
  uVar5 = 0;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  fdb_doc_create(&local_68,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
  do {
    st = *args;
    fVar1 = fdb_get_all_snap_markers((fdb_file_handle *)st,&local_60,&local_58);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00107bbb:
      disk_read_thread();
      iVar2 = 5;
      do {
        load_persons((storage_t *)st);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      return (void *)0x0;
    }
    local_50 = uVar5;
    if (local_58 == 0) {
      size = 0;
    }
    else {
      lVar4 = 0x10;
      uVar5 = 0;
      do {
        iVar2 = (int)*(undefined8 *)(*(long *)((long)&local_60->marker + lVar4) + 8);
        if (iVar2 != 0) {
          fVar1 = fdb_snapshot_open(*(fdb_kvs_handle **)((long)args + 8),&local_48,(long)iVar2);
          if (fVar1 == FDB_RESULT_SUCCESS) {
            local_68->seqnum = (long)iVar2;
            st = local_48;
            fVar1 = fdb_get_byseq(local_48,local_68);
            if (fVar1 == FDB_RESULT_SUCCESS) {
              if (*(int *)((long)local_68->body + 0xe08) <= iVar2) goto LAB_00107b65;
            }
            else {
              disk_read_thread();
            }
            disk_read_thread();
            goto LAB_00107bbb;
          }
        }
LAB_00107b65:
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x18;
        size = local_58;
      } while (uVar5 < local_58);
    }
    fdb_free_snap_markers(local_60,size);
    uVar3 = (int)local_50 + 1;
    uVar5 = (ulong)uVar3;
    if (uVar3 == 10) {
      fdb_doc_free(local_68);
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

void *disk_read_thread(void *args) {
    TEST_INIT();
    int n;
    uint64_t i;
    int seqno;
    uint64_t num_markers;
    fdb_snapshot_info_t *markers;
    fdb_kvs_handle *snap_db;
    fdb_status status;
    fdb_doc *doc;
    person_t p;
    fdb_doc_create(&doc, NULL, 0, NULL, 0, NULL, 0);

    storage_t *st = (storage_t *)args;

    for (n = 0; n < 10; ++n) {
        status = fdb_get_all_snap_markers(st->main, &markers,
                                          &num_markers);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        for (i = 0; i < num_markers; i++) {
            // open disk snapshot to each marker
            seqno = markers[i].kvs_markers[0].seqnum;
            if (!seqno) {
                continue;
            }
            status = fdb_snapshot_open(st->all_docs, &snap_db, seqno);
            if (status == FDB_RESULT_SUCCESS) {
                doc->seqnum = seqno;
                // can get doc
                status = fdb_get_byseq(snap_db, doc);
                TEST_CHK(status == FDB_RESULT_SUCCESS);

                // verify
                memcpy(&p, (person_t *)doc->body, sizeof(person_t));
                TEST_CHK(p.age <= seqno)
            }
        }
        fdb_free_snap_markers(markers, num_markers);
    }

    fdb_doc_free(doc);
    return NULL;
}